

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<int>
          (AsciiParser *this,char sep,char end_symbol,vector<int,_std::allocator<int>_> *result)

{
  bool bVar1;
  allocator local_79;
  string local_78;
  int local_58;
  char local_53;
  char local_52;
  allocator local_51;
  int value_1;
  char nc;
  char c;
  int local_2c;
  vector<int,_std::allocator<int>_> *pvStack_28;
  int value;
  vector<int,_std::allocator<int>_> *result_local;
  char end_symbol_local;
  AsciiParser *pAStack_18;
  char sep_local;
  AsciiParser *this_local;
  
  pvStack_28 = result;
  result_local._6_1_ = end_symbol;
  result_local._7_1_ = sep;
  pAStack_18 = this;
  ::std::vector<int,_std::allocator<int>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,&local_2c);
    if (bVar1) {
      ::std::vector<int,_std::allocator<int>_>::push_back(pvStack_28,&local_2c);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,&local_52);
        if (!bVar1) {
          return false;
        }
        if (local_52 == result_local._7_1_) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,&local_53);
          if (!bVar1) {
            return false;
          }
          if (local_53 == result_local._6_1_) break;
        }
        if (local_52 != result_local._7_1_) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,&local_58);
        if (!bVar1) break;
        ::std::vector<int,_std::allocator<int>_>::push_back(pvStack_28,&local_58);
      }
      bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(pvStack_28);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_78,"Empty array.\n",&local_79);
        PushError(this,&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&value_1,"Not starting with the value of requested type.\n",&local_51);
      PushError(this,(string *)&value_1);
      ::std::__cxx11::string::~string((string *)&value_1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}